

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

String * __thiscall
cxxopts::Options::help_one_group(String *__return_storage_ptr__,Options *this,string *g)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  long *plVar7;
  const_iterator cVar8;
  ulong uVar9;
  ulong *puVar10;
  size_type *psVar11;
  _Alloc_hider _Var12;
  pointer __rhs;
  undefined8 uVar13;
  ulong uVar14;
  _Alloc_hider _Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _Alloc_hider _Var17;
  _Base_ptr p_Var18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  String s;
  String d;
  OptionHelp format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  String *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  _Base_ptr local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  pointer local_f8;
  undefined2 *local_f0;
  _Base_ptr local_e8;
  undefined2 local_e0;
  undefined1 uStack_de;
  undefined5 uStack_dd;
  undefined1 *local_d0;
  ulong local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  _Base_ptr local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Options *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Base_ptr local_60;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  _Base_ptr local_38;
  
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cxxopts::HelpGroupDetails>_>_>
          ::find(&(this->m_help)._M_t,g);
  local_88 = this;
  if ((_Rb_tree_header *)cVar6._M_node == &(this->m_help)._M_t._M_impl.super__Rb_tree_header) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar16 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar16;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    local_170 = __return_storage_ptr__;
    if (g->_M_string_length != 0) {
      std::operator+(&local_118," ",g);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
      paVar1 = &local_190.field_2;
      puVar10 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_190.field_2._M_allocated_capacity = *puVar10;
        local_190.field_2._8_8_ = plVar7[3];
        local_190._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_190.field_2._M_allocated_capacity = *puVar10;
        local_190._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_160.first._M_string_length = plVar7[1];
      *plVar7 = (long)puVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      paVar2 = &local_160.first.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p == paVar1) {
        local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
        local_190._M_dataplus._M_p = (pointer)paVar2;
      }
      local_160.first.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
      local_190._M_string_length = 0;
      local_190.field_2._M_allocated_capacity =
           local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
      local_190._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_160.first._M_dataplus._M_p,
                        local_160.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != paVar1) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    __rhs = *(pointer *)(cVar6._M_node + 4);
    local_f8 = (pointer)cVar6._M_node[4]._M_parent;
    local_168 = paVar16;
    if (__rhs != local_f8) {
      local_88 = (Options *)&local_88->m_positional_set;
      paVar16 = &local_160.second.field_2;
      local_120 = (_Base_ptr)0x0;
      local_b0 = cVar6._M_node;
      do {
        if ((__rhs[3].first.field_2._M_local_buf[0] != '\x01') ||
           (cVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_88,&__rhs->second),
           cVar8.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur == (__node_type *)0x0)) {
          local_f0 = &local_e0;
          local_e0 = 0x2020;
          local_e8 = (_Base_ptr)0x2;
          uStack_de = 0;
          if ((_Base_ptr)(__rhs->first)._M_string_length == (_Base_ptr)0x0) {
            std::__cxx11::string::append((char *)&local_f0);
          }
          else {
            std::operator+(&local_190,"-",&__rhs->first);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_190);
            local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            puVar10 = (ulong *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar10) {
              local_160.first.field_2._M_allocated_capacity = *puVar10;
              local_160.first.field_2._8_8_ = plVar7[3];
            }
            else {
              local_160.first.field_2._M_allocated_capacity = *puVar10;
              local_160.first._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_160.first._M_string_length = plVar7[1];
            *plVar7 = (long)puVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append
                      ((char *)&local_f0,(ulong)local_160.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
              operator_delete(local_160.first._M_dataplus._M_p,
                              local_160.first.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((__rhs->second)._M_string_length != 0) {
            std::operator+(&local_160.first," --",&__rhs->second);
            std::__cxx11::string::_M_append
                      ((char *)&local_f0,(ulong)local_160.first._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
              operator_delete(local_160.first._M_dataplus._M_p,
                              local_160.first.field_2._M_allocated_capacity + 1);
            }
          }
          if (*(char *)&__rhs[1].second._M_dataplus._M_p == '\x01') {
            lVar3 = *(long *)((long)&__rhs[2].second.field_2 + 8);
            local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            if (lVar3 == 0) {
              local_160.first._M_string_length = 3;
              local_160.first.field_2._M_allocated_capacity._0_4_ = 0x677261;
            }
            else {
              sVar4 = __rhs[2].second.field_2._M_allocated_capacity;
              std::__cxx11::string::_M_construct<char*>((string *)&local_160,sVar4,sVar4 + lVar3);
            }
            if (*(char *)&__rhs[2].first._M_string_length == '\x01') {
              std::operator+(&local_80," [=",&local_160.first);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
              local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
              psVar11 = (size_type *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_a8.field_2._M_allocated_capacity = *psVar11;
                local_a8.field_2._8_8_ = plVar7[3];
              }
              else {
                local_a8.field_2._M_allocated_capacity = *psVar11;
                local_a8._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_a8._M_string_length = plVar7[1];
              *plVar7 = (long)psVar11;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_a8,
                                          (ulong)__rhs[2].first.field_2._M_allocated_capacity);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              puVar10 = (ulong *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_118.field_2._M_allocated_capacity = *puVar10;
                local_118.field_2._8_8_ = plVar7[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar10;
                local_118._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_118._M_string_length = plVar7[1];
              *plVar7 = (long)puVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_118);
              local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
              puVar10 = (ulong *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_190.field_2._M_allocated_capacity = *puVar10;
                local_190.field_2._8_8_ = plVar7[3];
              }
              else {
                local_190.field_2._M_allocated_capacity = *puVar10;
                local_190._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_190._M_string_length = plVar7[1];
              *plVar7 = (long)puVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_190._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar13 = CONCAT62(local_80.field_2._M_allocated_capacity._2_6_,
                                  local_80.field_2._M_allocated_capacity._0_2_);
                _Var12._M_p = local_80._M_dataplus._M_p;
LAB_00120c62:
                operator_delete(_Var12._M_p,uVar13 + 1);
              }
            }
            else {
              std::operator+(&local_190," ",&local_160.first);
              std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_190._M_dataplus._M_p);
              uVar13 = local_190.field_2._M_allocated_capacity;
              _Var12._M_p = local_190._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) goto LAB_00120c62;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
              operator_delete(local_160.first._M_dataplus._M_p,
                              local_160.first.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_120 <= local_e8) {
            local_120 = local_e8;
          }
          paVar1 = &local_190.field_2;
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_f0,
                     (byte *)((long)&local_e8->_M_color + (long)local_f0));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p == paVar1) {
            local_160.second.field_2._8_8_ = local_190.field_2._8_8_;
            local_160.second._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_160.second._M_dataplus._M_p = local_190._M_dataplus._M_p;
          }
          local_160.second.field_2._M_allocated_capacity = local_190.field_2._M_allocated_capacity;
          local_160.second._M_string_length = local_190._M_string_length;
          local_190._M_string_length = 0;
          local_190.field_2._M_allocated_capacity =
               local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_190._M_dataplus._M_p = (pointer)paVar1;
          std::
          vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
          ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                      *)&local_58,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.second._M_dataplus._M_p != paVar16) {
            operator_delete(local_160.second._M_dataplus._M_p,
                            local_160.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160.first._M_dataplus._M_p != &local_160.first.field_2) {
            operator_delete(local_160.first._M_dataplus._M_p,
                            local_160.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,CONCAT53(uStack_dd,CONCAT12(uStack_de,local_e0)) + 1);
          }
        }
        __rhs = (pointer)(__rhs[3].first.field_2._M_local_buf + 8);
      } while (__rhs != local_f8);
      p_Var18 = *(_Base_ptr *)(local_b0 + 4);
      local_38 = local_b0[4]._M_parent;
      local_60 = (_Base_ptr)0x1e;
      if (local_120 < (_Base_ptr)0x1e) {
        local_60 = local_120;
      }
      __return_storage_ptr__ = local_170;
      if (p_Var18 != local_38) {
        uVar14 = 0x4a - (long)local_60;
        local_f8 = local_58.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_120 = (_Base_ptr)((long)&local_60->_M_color + 2);
        do {
          if ((*(char *)&p_Var18[6]._M_left != '\x01') ||
             (cVar8 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)local_88,(key_type *)(p_Var18 + 1)),
             cVar8.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur == (__node_type *)0x0)) {
            local_160.first._M_dataplus._M_p = (pointer)&local_160.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_160,*(long *)(p_Var18 + 2),
                       (long)&(p_Var18[2]._M_parent)->_M_color + *(long *)(p_Var18 + 2));
            if (*(byte *)((long)&p_Var18[3]._M_color + 1) == 1) {
              std::operator+(&local_a8," (default: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &p_Var18[3]._M_parent);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
              paVar16 = &local_118.field_2;
              puVar10 = (ulong *)(plVar7 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar7 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar10) {
                local_118.field_2._M_allocated_capacity = *puVar10;
                local_118.field_2._8_8_ = plVar7[3];
                local_118._M_dataplus._M_p = (pointer)paVar16;
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar10;
                local_118._M_dataplus._M_p = (pointer)*plVar7;
              }
              local_190._M_string_length = plVar7[1];
              *plVar7 = (long)puVar10;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p == paVar16) {
                local_190.field_2._8_8_ = local_118.field_2._8_8_;
                local_118._M_dataplus._M_p = (pointer)&local_190.field_2;
              }
              local_190.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
              local_118._M_string_length = 0;
              local_118.field_2._M_allocated_capacity =
                   local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_190._M_dataplus._M_p = local_118._M_dataplus._M_p;
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_118._M_dataplus._M_p;
              local_118._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_append((char *)&local_160,(ulong)paVar1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p != &local_190.field_2) {
                operator_delete(local_190._M_dataplus._M_p,
                                local_190.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            local_d0 = &local_c0;
            local_c8 = 0;
            local_c0 = 0;
            _Var12._M_p = local_160.first._M_dataplus._M_p;
            local_b0 = p_Var18;
            if (local_160.first._M_string_length != 0) {
              uVar9 = 0;
              _Var15._M_p = local_160.first._M_dataplus._M_p;
              _Var17._M_p = local_160.first._M_dataplus._M_p;
              do {
                if (*_Var17._M_p == ' ') {
                  _Var15._M_p = _Var17._M_p;
                }
                if (uVar14 < uVar9) {
                  if (_Var15._M_p == _Var12._M_p) {
                    std::__cxx11::string::replace
                              ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var12._M_p);
                    paVar16 = &local_80.field_2;
                    local_80.field_2._M_allocated_capacity._0_2_ = 10;
                    local_80._M_string_length = 1;
                    local_80._M_dataplus._M_p = (pointer)paVar16;
                    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)paVar16);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_80._M_dataplus._M_p != paVar16) {
                      operator_delete(local_80._M_dataplus._M_p,
                                      CONCAT62(local_80.field_2._M_allocated_capacity._2_6_,
                                               local_80.field_2._M_allocated_capacity._0_2_) + 1);
                    }
                    std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_d0,local_c8,0,(char)local_120);
                    _Var12._M_p = _Var17._M_p + 1;
                    _Var15._M_p = _Var12._M_p;
                  }
                  else {
                    std::__cxx11::string::replace
                              ((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var12._M_p);
                    local_e0 = 10;
                    local_e8 = (_Base_ptr)0x1;
                    local_f0 = &local_e0;
                    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)&local_e0);
                    if (local_f0 != &local_e0) {
                      operator_delete(local_f0,CONCAT53(uStack_dd,CONCAT12(uStack_de,local_e0)) + 1)
                      ;
                    }
                    std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_d0,local_c8,0,(char)local_120);
                    _Var12._M_p = _Var15._M_p + 1;
                  }
                  uVar9 = 0;
                }
                else {
                  uVar9 = uVar9 + 1;
                }
                _Var17._M_p = _Var17._M_p + 1;
              } while (_Var17._M_p !=
                       local_160.first._M_dataplus._M_p + local_160.first._M_string_length);
            }
            __return_storage_ptr__ = local_170;
            paVar16 = &local_160.first.field_2;
            std::__cxx11::string::replace((ulong)&local_d0,local_c8,(char *)0x0,(ulong)_Var12._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160.first._M_dataplus._M_p != paVar16) {
              operator_delete(local_160.first._M_dataplus._M_p,
                              local_160.first.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)(local_f8->first)._M_dataplus._M_p);
            p_Var5 = (_Base_ptr)(local_f8->first)._M_string_length;
            if (local_60 < p_Var5) {
              std::__cxx11::string::push_back((char)__return_storage_ptr__);
              paVar16 = &local_190.field_2;
              local_190._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_120);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p == paVar16) {
                local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
                local_190._M_dataplus._M_p = (pointer)&local_160.first.field_2;
              }
              local_160.first.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity;
              local_160.first._M_string_length = local_190._M_string_length;
              local_190._M_string_length = 0;
              local_190.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
              local_190._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
              bVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_160.first._M_dataplus._M_p == &local_160.first.field_2;
            }
            else {
              paVar1 = &local_190.field_2;
              local_190._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct((ulong)&local_190,(char)local_120 - (char)p_Var5);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_190._M_dataplus._M_p == paVar1) {
                local_160.first.field_2._8_8_ = local_190.field_2._8_8_;
                local_190._M_dataplus._M_p = (pointer)paVar16;
              }
              local_160.first.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity;
              local_160.first._M_string_length = local_190._M_string_length;
              local_190._M_string_length = 0;
              local_190.field_2._M_allocated_capacity =
                   local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_160.first._M_dataplus._M_p = local_190._M_dataplus._M_p;
              local_190._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_160.first._M_dataplus._M_p);
              bVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_160.first._M_dataplus._M_p == paVar16;
            }
            p_Var18 = local_b0;
            if (!bVar19) {
              operator_delete(local_160.first._M_dataplus._M_p,
                              local_160.first.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            if (local_d0 != &local_c0) {
              operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
            }
            local_f8 = local_f8 + 1;
          }
          p_Var18 = (_Base_ptr)&p_Var18[6]._M_right;
        } while (p_Var18 != local_38);
      }
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

String
Options::help_one_group(const std::string& g) const
{
  typedef std::vector<std::pair<String, String>> OptionHelp;

  auto group = m_help.find(g);
  if (group == m_help.end())
  {
    return "";
  }

  OptionHelp format;

  size_t longest = 0;

  String result;

  if (!g.empty())
  {
    result += toLocalString(" " + g + " options:\n");
  }

  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto s = format_option(o);
    longest = std::max(longest, stringLength(s));
    format.push_back(std::make_pair(s, String()));
  }

  longest = std::min(longest, static_cast<size_t>(OPTION_LONGEST));

  //widest allowed description
  auto allowed = size_t{76} - longest - OPTION_DESC_GAP;

  auto fiter = format.begin();
  for (const auto& o : group->second.options)
  {
    if (o.is_container && m_positional_set.find(o.l) != m_positional_set.end())
    {
      continue;
    }

    auto d = format_description(o, longest + OPTION_DESC_GAP, allowed);

    result += fiter->first;
    if (stringLength(fiter->first) > longest)
    {
      result += '\n';
      result += toLocalString(std::string(longest + OPTION_DESC_GAP, ' '));
    }
    else
    {
      result += toLocalString(std::string(longest + OPTION_DESC_GAP -
        stringLength(fiter->first),
        ' '));
    }
    result += d;
    result += '\n';

    ++fiter;
  }

  return result;
}